

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_alignof(lua_State *L)

{
  CTState *cts;
  uint in_EAX;
  CTypeID id;
  CTInfo CVar1;
  CTSize sz;
  undefined8 uStack_18;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  uStack_18._0_4_ = in_EAX;
  id = ffi_checkctype(L,cts,(TValue *)0x0);
  uStack_18 = (ulong)(uint)uStack_18;
  CVar1 = lj_ctype_info_raw(cts,id,(CTSize *)((long)&uStack_18 + 4));
  L->top[-1].n = (double)(1 << ((byte)(CVar1 >> 0x10) & 0xf));
  return 1;
}

Assistant:

LJLIB_CF(ffi_alignof)	LJLIB_REC(ffi_xof FF_ffi_alignof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CTSize sz = 0;
  CTInfo info = lj_ctype_info_raw(cts, id, &sz);
  setintV(L->top-1, 1 << ctype_align(info));
  return 1;
}